

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

string * __thiscall
flatbuffers::dart::DartGenerator::getDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,Value *value)

{
  bool bVar1;
  ulong uVar2;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  Value *local_20;
  Value *value_local;
  DartGenerator *this_local;
  
  local_20 = value;
  value_local = (Value *)this;
  this_local = (DartGenerator *)__return_storage_ptr__;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (bVar1 = std::operator!=(&local_20->constant,"0"), bVar1)) {
    bVar1 = IsBool((local_20->type).base_type);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"true",&local_21);
      std::allocator<char>::~allocator(&local_21);
    }
    else {
      bVar1 = IsScalar((local_20->type).base_type);
      if (bVar1) {
        bVar1 = StringIsFlatbufferNan(&local_20->constant);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"double.nan",local_35);
          std::allocator<char>::~allocator(local_35);
          return __return_storage_ptr__;
        }
        bVar1 = StringIsFlatbufferPositiveInfinity(&local_20->constant);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"double.infinity",&local_36);
          std::allocator<char>::~allocator(&local_36);
          return __return_storage_ptr__;
        }
        bVar1 = StringIsFlatbufferNegativeInfinity(&local_20->constant);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"double.negativeInfinity",&local_37);
          std::allocator<char>::~allocator(&local_37);
          return __return_storage_ptr__;
        }
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_20->constant);
    }
  }
  else {
    bVar1 = IsBool((local_20->type).base_type);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"false",&local_38);
      std::allocator<char>::~allocator(&local_38);
    }
    else {
      bVar1 = IsScalar((local_20->type).base_type);
      if ((!bVar1) || (bVar1 = IsUnion(&local_20->type), bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_3a);
        std::allocator<char>::~allocator(&local_3a);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"0",&local_39);
        std::allocator<char>::~allocator(&local_39);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getDefaultValue(const Value &value) const {
    if (!value.constant.empty() && value.constant != "0") {
      if (IsBool(value.type.base_type)) { return "true"; }
      if (IsScalar(value.type.base_type)) {
        if (StringIsFlatbufferNan(value.constant)) {
          return "double.nan";
        } else if (StringIsFlatbufferPositiveInfinity(value.constant)) {
          return "double.infinity";
        } else if (StringIsFlatbufferNegativeInfinity(value.constant)) {
          return "double.negativeInfinity";
        }
      }
      return value.constant;
    } else if (IsBool(value.type.base_type)) {
      return "false";
    } else if (IsScalar(value.type.base_type) && !IsUnion(value.type)) {
      return "0";
    } else {
      return "";
    }
  }